

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

void CGL::SVGParser::parseTexture(XMLElement *xml)

{
  pointer __s;
  uint uVar1;
  char *__s_00;
  ostream *poVar2;
  reference __x;
  Texture *this;
  mapped_type *ppTVar3;
  Texture *tex;
  uint local_e0;
  int k;
  int x;
  int y;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels_no_alpha;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  uint local_74;
  uint local_70;
  int err;
  uint height;
  uint width;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  char *file;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string texid;
  XMLElement *xml_local;
  
  texid.field_2._8_8_ = xml;
  __s_00 = tinyxml2::XMLElement::Attribute(xml,"texid",(char *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,__s_00,&local_31);
  std::allocator<char>::~allocator(&local_31);
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)tinyxml2::XMLElement::Attribute
                          ((XMLElement *)texid.field_2._8_8_,"filename",(char *)0x0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&height);
  __s = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,(char *)__s,
             (allocator<char> *)
             ((long)&pixels_no_alpha.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::operator+(&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dir_abi_cxx11_
                 ,&local_b8);
  uVar1 = lodepng::decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&height,
                          (uint *)&err,&local_70,&local_98,LCT_RGBA,8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pixels_no_alpha.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_74 = uVar1;
  if (uVar1 == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&x);
    for (k = 0; (uint)k < local_70; k = k + 1) {
      for (local_e0 = 0; local_e0 < (uint)err; local_e0 = local_e0 + 1) {
        for (tex._4_4_ = 0; tex._4_4_ < 3; tex._4_4_ = tex._4_4_ + 1) {
          __x = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&height,
                           (ulong)(tex._4_4_ + (k * err + local_e0) * 4));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&x,__x);
        }
      }
    }
    this = (Texture *)operator_new(0x28);
    (this->mipmap).super__Vector_base<CGL::MipLevel,_std::allocator<CGL::MipLevel>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->mipmap).super__Vector_base<CGL::MipLevel,_std::allocator<CGL::MipLevel>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this->width = 0;
    this->height = 0;
    (this->mipmap).super__Vector_base<CGL::MipLevel,_std::allocator<CGL::MipLevel>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Texture::Texture(this);
    Texture::init(this,(EVP_PKEY_CTX *)&x);
    ppTVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*>_>_>
                            *)(curr_svg + 0x20),(key_type *)local_30);
    *ppTVar3 = this;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&x);
    pixels_no_alpha.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr," could not load image ");
    poVar2 = std::operator<<(poVar2,(char *)pixels.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pixels_no_alpha.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&height);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void SVGParser::parseTexture( XMLElement* xml ) {
  string texid = xml->Attribute("texid");

  const char* file = xml->Attribute( "filename" );
  vector<unsigned char> pixels;
  unsigned int width, height;
  int err = lodepng::decode(pixels, width, height, dir + string(file));
  if (err) {
    cerr << " could not load image " << file << endl;
    return;
  }

  // Strip the alpha channel
  vector<unsigned char> pixels_no_alpha;
  for (int y = 0; y < height; ++y) {
    for (int x = 0; x < width; ++x) {
      for (int k = 0; k < 3; ++k) {
        pixels_no_alpha.push_back(pixels[4 * (y * width + x) + k]);
      }
    }
  }

  Texture *tex = new Texture();
  tex->init(pixels_no_alpha, width, height);
  curr_svg->textures[texid] = tex;

}